

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall QDockAreaLayoutInfo::reparentWidgets(QDockAreaLayoutInfo *this,QWidget *parent)

{
  uint uVar1;
  QDockAreaLayoutItem *pQVar2;
  QDockAreaLayoutInfo *this_00;
  long *plVar3;
  QWidget *this_01;
  QDockWidgetGroupWindow *pQVar4;
  long lVar5;
  int i;
  ulong uVar6;
  
  if (&this->tabBar->super_QWidget != (QWidget *)0x0) {
    QWidget::setParent(&this->tabBar->super_QWidget,parent);
  }
  lVar5 = 0;
  for (uVar6 = 0; uVar6 < (ulong)(this->item_list).d.size; uVar6 = uVar6 + 1) {
    pQVar2 = (this->item_list).d.ptr;
    if ((*(byte *)((long)&pQVar2->flags + lVar5) & 1) == 0) {
      this_00 = *(QDockAreaLayoutInfo **)((long)&pQVar2->subinfo + lVar5);
      if (this_00 != (QDockAreaLayoutInfo *)0x0) {
        reparentWidgets(this_00,parent);
      }
      plVar3 = *(long **)((long)&pQVar2->widgetItem + lVar5);
      if (plVar3 != (long *)0x0) {
        this_01 = (QWidget *)(**(code **)(*plVar3 + 0x68))();
        pQVar4 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>((QObject *)this_01)
        ;
        if ((pQVar4 == (QDockWidgetGroupWindow *)0x0) &&
           (*(QWidget **)(*(long *)&this_01->field_0x8 + 0x10) != parent)) {
          uVar1 = this_01->data->widget_attributes;
          QWidget::setParent(this_01,parent,
                             (WindowFlags)
                             (this_01->data->window_flags).
                             super_QFlagsStorageHelper<Qt::WindowType,_4>.
                             super_QFlagsStorage<Qt::WindowType>.i);
          if ((uVar1 >> 0x10 & 1) == 0) {
            QWidget::show(this_01);
          }
        }
      }
    }
    lVar5 = lVar5 + 0x28;
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::reparentWidgets(QWidget *parent)
{
    if (tabBar)
        tabBar->setParent(parent);

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.flags & QDockAreaLayoutItem::GapItem)
            continue;
        if (item.subinfo)
            item.subinfo->reparentWidgets(parent);
        if (item.widgetItem) {
            QWidget *w = item.widgetItem->widget();
            if (qobject_cast<QDockWidgetGroupWindow *>(w))
                continue;
            if (w->parent() != parent) {
                bool hidden = w->isHidden();
                w->setParent(parent, w->windowFlags());
                if (!hidden)
                    w->show();
            }
        }
    }
}